

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZVec<TPZGeoElBC_*>::TPZVec(TPZVec<TPZGeoElBC_*> *this,initializer_list<TPZGeoElBC_*> *list)

{
  ulong uVar1;
  iterator ppTVar2;
  TPZGeoElBC **ppTVar3;
  long lVar4;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b830;
  this->fStore = (TPZGeoElBC **)0x0;
  uVar1 = list->_M_len;
  if (uVar1 != 0) {
    ppTVar3 = (TPZGeoElBC **)operator_new__(-(ulong)(uVar1 >> 0x3d != 0) | uVar1 * 8);
    this->fStore = ppTVar3;
    ppTVar2 = list->_M_array;
    ppTVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined8 *)((long)ppTVar3 + lVar4) = *(undefined8 *)((long)ppTVar2 + lVar4);
      lVar4 = lVar4 + 8;
    } while (uVar1 * 8 - lVar4 != 0);
  }
  this->fNElements = uVar1;
  this->fNAlloc = uVar1;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const std::initializer_list<T>& list) : fStore(nullptr) {
    const auto size = list.size();
	if (size > 0)
		fStore = new T[size];

	auto it = list.begin();
	auto it_end = list.end();
	T* aux = fStore;
	for (; it != it_end; it++, aux++)
		*aux = *it;

	fNElements = size;
    fNAlloc = size;
}